

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparcModule.c
# Opt level: O0

cs_err Sparc_global_init(cs_struct *ud)

{
  void *pvVar1;
  long in_RDI;
  MCRegisterInfo *mri;
  MCRegisterInfo *in_stack_00000020;
  
  pvVar1 = (*cs_mem_malloc)(0x58);
  Sparc_init(in_stack_00000020);
  *(code **)(in_RDI + 8) = Sparc_printInst;
  *(void **)(in_RDI + 0x10) = pvVar1;
  *(void **)(in_RDI + 0x20) = pvVar1;
  *(code **)(in_RDI + 0x18) = Sparc_getInstruction;
  *(code **)(in_RDI + 0x48) = Sparc_post_printer;
  *(code **)(in_RDI + 0x28) = Sparc_reg_name;
  *(code **)(in_RDI + 0x40) = Sparc_get_insn_id;
  *(code **)(in_RDI + 0x30) = Sparc_insn_name;
  *(code **)(in_RDI + 0x38) = Sparc_group_name;
  return CS_ERR_OK;
}

Assistant:

cs_err Sparc_global_init(cs_struct *ud)
{
	MCRegisterInfo *mri;
	mri = cs_mem_malloc(sizeof(*mri));

	Sparc_init(mri);
	ud->printer = Sparc_printInst;
	ud->printer_info = mri;
	ud->getinsn_info = mri;
	ud->disasm = Sparc_getInstruction;
	ud->post_printer = Sparc_post_printer;

	ud->reg_name = Sparc_reg_name;
	ud->insn_id = Sparc_get_insn_id;
	ud->insn_name = Sparc_insn_name;
	ud->group_name = Sparc_group_name;

	return CS_ERR_OK;
}